

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

uint __thiscall ON_Brep::ClearComponentStates(ON_Brep *this,ON_ComponentStatus states_to_clear)

{
  uchar uVar1;
  uchar uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  ON_BrepVertex *pOVar9;
  ON_BrepEdge *pOVar10;
  ON_BrepTrim *pOVar11;
  ON_BrepLoop *pOVar12;
  ON_BrepFace *pOVar13;
  uint uVar14;
  ON_BrepVertex *pOVar15;
  ON_BrepVertex *pOVar16;
  ON_BrepEdge *pOVar17;
  ON_BrepEdge *pOVar18;
  ON_BrepTrim *pOVar19;
  ON_BrepTrim *pOVar20;
  ON_BrepLoop *pOVar21;
  ON_BrepLoop *pOVar22;
  ON_BrepFace *pOVar23;
  ON_BrepFace *pOVar24;
  ON_BrepVertex *pOVar25;
  ON_BrepEdge *pOVar26;
  ON_BrepTrim *pOVar27;
  ON_BrepLoop *pOVar28;
  ON_BrepFace *pOVar29;
  ON_ComponentStatus local_32;
  
  bVar7 = ON_ComponentStatus::IsClear(&local_32);
  uVar4 = ON_AggregateComponentStatus::NotCurrent._24_8_;
  uVar3 = ON_AggregateComponentStatus::NotCurrent._8_8_;
  uVar5 = ON_AggregateComponentStatus::NotCurrent._0_8_;
  uVar14 = 0;
  if (!bVar7) {
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_hidden_count;
    (this->m_aggregate_status).m_highlighted_count =
         ON_AggregateComponentStatus::NotCurrent.m_highlighted_count;
    uVar6 = ON_AggregateComponentStatus::NotCurrent._24_8_;
    (this->m_aggregate_status).m_hidden_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_locked_count = (uint)uVar4;
    ON_AggregateComponentStatus::NotCurrent.m_damaged_count = SUB84(uVar4,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_damaged_count;
    (this->m_aggregate_status).m_locked_count =
         ON_AggregateComponentStatus::NotCurrent.m_locked_count;
    ON_AggregateComponentStatus::NotCurrent._24_8_ = uVar6;
    uVar4 = ON_AggregateComponentStatus::NotCurrent._0_8_;
    (this->m_aggregate_status).m_damaged_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_aggregate_status = SUB82(uVar5,0);
    ON_AggregateComponentStatus::NotCurrent.m_current = SUB81(uVar5,2);
    uVar1 = ON_AggregateComponentStatus::NotCurrent.m_current;
    ON_AggregateComponentStatus::NotCurrent.m_reserved1 = SUB81(uVar5,3);
    uVar2 = ON_AggregateComponentStatus::NotCurrent.m_reserved1;
    ON_AggregateComponentStatus::NotCurrent.m_component_count = SUB84(uVar5,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_component_count;
    (this->m_aggregate_status).m_aggregate_status =
         ON_AggregateComponentStatus::NotCurrent.m_aggregate_status;
    ON_AggregateComponentStatus::NotCurrent._0_8_ = uVar4;
    uVar5 = ON_AggregateComponentStatus::NotCurrent._8_8_;
    (this->m_aggregate_status).m_current = uVar1;
    (this->m_aggregate_status).m_reserved1 = uVar2;
    (this->m_aggregate_status).m_component_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_selected_count = (uint)uVar3;
    ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count = SUB84(uVar3,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count;
    (this->m_aggregate_status).m_selected_count =
         ON_AggregateComponentStatus::NotCurrent.m_selected_count;
    ON_AggregateComponentStatus::NotCurrent._8_8_ = uVar5;
    (this->m_aggregate_status).m_selected_persistent_count = uVar14;
    pOVar9 = (ON_BrepVertex *)
             (ulong)(uint)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count;
    pOVar25 = pOVar9;
    if (pOVar9 != (ON_BrepVertex *)0x0) {
      pOVar25 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                m_a;
    }
    uVar14 = 0;
    pOVar15 = pOVar25;
    local_32 = states_to_clear;
    while (pOVar15 != (ON_BrepVertex *)0x0) {
      uVar8 = ON_ComponentStatus::ClearStates(&pOVar15->m_status,local_32);
      uVar14 = uVar14 + uVar8;
      pOVar16 = pOVar15 + 1;
      if (pOVar25 + (long)((long)&pOVar9[-1].m_tolerance + 7) <= pOVar15) {
        pOVar16 = (ON_BrepVertex *)0x0;
      }
      pOVar15 = pOVar16;
      if (pOVar25 == (ON_BrepVertex *)0x0) {
        pOVar15 = pOVar25;
      }
    }
    pOVar10 = (ON_BrepEdge *)
              (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                           super_ON_ClassArray<ON_BrepEdge>.m_count;
    pOVar26 = pOVar10;
    if (pOVar10 != (ON_BrepEdge *)0x0) {
      pOVar26 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    }
    pOVar17 = pOVar26;
    while (pOVar17 != (ON_BrepEdge *)0x0) {
      uVar8 = ON_ComponentStatus::ClearStates(&pOVar17->m_status,local_32);
      uVar14 = uVar14 + uVar8;
      pOVar18 = pOVar17 + 1;
      if (pOVar26 + (long)((long)&pOVar10[-1].m_brep + 7) <= pOVar17) {
        pOVar18 = (ON_BrepEdge *)0x0;
      }
      pOVar17 = pOVar18;
      if (pOVar26 == (ON_BrepEdge *)0x0) {
        pOVar17 = pOVar26;
      }
    }
    pOVar11 = (ON_BrepTrim *)
              (ulong)(uint)(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_count;
    pOVar27 = pOVar11;
    if (pOVar11 != (ON_BrepTrim *)0x0) {
      pOVar27 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    }
    pOVar19 = pOVar27;
    while (pOVar19 != (ON_BrepTrim *)0x0) {
      uVar8 = ON_ComponentStatus::ClearStates(&pOVar19->m_status,local_32);
      uVar14 = uVar14 + uVar8;
      pOVar20 = pOVar19 + 1;
      if (pOVar27 + (long)((long)&pOVar11[-1].m_brep + 7) <= pOVar19) {
        pOVar20 = (ON_BrepTrim *)0x0;
      }
      pOVar19 = pOVar20;
      if (pOVar27 == (ON_BrepTrim *)0x0) {
        pOVar19 = pOVar27;
      }
    }
    pOVar12 = (ON_BrepLoop *)
              (ulong)(uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_count;
    pOVar28 = pOVar12;
    if (pOVar12 != (ON_BrepLoop *)0x0) {
      pOVar28 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    }
    pOVar21 = pOVar28;
    while (pOVar21 != (ON_BrepLoop *)0x0) {
      uVar8 = ON_ComponentStatus::ClearStates(&pOVar21->m_status,local_32);
      uVar14 = uVar14 + uVar8;
      pOVar22 = pOVar21 + 1;
      if (pOVar28 + (long)((long)&pOVar12[-1].m_brep + 7) <= pOVar21) {
        pOVar22 = (ON_BrepLoop *)0x0;
      }
      pOVar21 = pOVar22;
      if (pOVar28 == (ON_BrepLoop *)0x0) {
        pOVar21 = pOVar28;
      }
    }
    pOVar13 = (ON_BrepFace *)
              (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                           super_ON_ClassArray<ON_BrepFace>.m_count;
    pOVar29 = pOVar13;
    if (pOVar13 != (ON_BrepFace *)0x0) {
      pOVar29 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    }
    pOVar23 = pOVar29;
    while (pOVar23 != (ON_BrepFace *)0x0) {
      uVar8 = ON_ComponentStatus::ClearStates(&pOVar23->m_status,local_32);
      uVar14 = uVar14 + uVar8;
      pOVar24 = pOVar23 + 1;
      if (pOVar29 + (long)((long)&pOVar13[-1].m_brep + 7) <= pOVar23) {
        pOVar24 = (ON_BrepFace *)0x0;
      }
      pOVar23 = pOVar24;
      if (pOVar29 == (ON_BrepFace *)0x0) {
        pOVar23 = pOVar29;
      }
    }
  }
  return uVar14;
}

Assistant:

unsigned int ON_Brep::ClearComponentStates(
  ON_ComponentStatus states_to_clear
  ) const
{
  if (states_to_clear.IsClear())
    return 0U;

  m_aggregate_status = ON_AggregateComponentStatus::NotCurrent;

  unsigned int rc = 0;

  ON_ArrayIterator< const ON_BrepVertex > vit( m_V.Array(), m_V.UnsignedCount() );
  for ( const ON_BrepVertex* p = vit.First(); nullptr != p; p = vit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepEdge > eit( m_E.Array(), m_E.UnsignedCount() );
  for ( const ON_BrepEdge* p = eit.First(); nullptr != p; p = eit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepTrim > tit( m_T.Array(), m_T.UnsignedCount() );
  for ( const ON_BrepTrim* p = tit.First(); nullptr != p; p = tit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepLoop > lit( m_L.Array(), m_L.UnsignedCount() );
  for ( const ON_BrepLoop* p = lit.First(); nullptr != p; p = lit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepFace > fit( m_F.Array(), m_F.UnsignedCount() );
  for ( const ON_BrepFace* p = fit.First(); nullptr != p; p = fit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  return rc;
}